

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sha.c
# Opt level: O2

int ndn_sha256_verify(uint8_t *input_value,uint32_t input_size,uint8_t *sig_value,uint32_t sig_size)

{
  int iVar1;
  int iVar2;
  uint8_t auStack_38 [8];
  uint8_t input_hash [32];
  
  if (sig_size == 0x20) {
    input_hash[8] = '\0';
    input_hash[9] = '\0';
    input_hash[10] = '\0';
    input_hash[0xb] = '\0';
    input_hash[0xc] = '\0';
    input_hash[0xd] = '\0';
    input_hash[0xe] = '\0';
    input_hash[0xf] = '\0';
    input_hash[0x10] = '\0';
    input_hash[0x11] = '\0';
    input_hash[0x12] = '\0';
    input_hash[0x13] = '\0';
    input_hash[0x14] = '\0';
    input_hash[0x15] = '\0';
    input_hash[0x16] = '\0';
    input_hash[0x17] = '\0';
    auStack_38[0] = '\0';
    auStack_38[1] = '\0';
    auStack_38[2] = '\0';
    auStack_38[3] = '\0';
    auStack_38[4] = '\0';
    auStack_38[5] = '\0';
    auStack_38[6] = '\0';
    auStack_38[7] = '\0';
    input_hash[0] = '\0';
    input_hash[1] = '\0';
    input_hash[2] = '\0';
    input_hash[3] = '\0';
    input_hash[4] = '\0';
    input_hash[5] = '\0';
    input_hash[6] = '\0';
    input_hash[7] = '\0';
    ndn_sha256(input_value,input_size,auStack_38);
    iVar1 = ndn_const_time_memcmp(auStack_38,sig_value,0x20);
    iVar2 = -0x1d;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    return iVar2;
  }
  return -0x17;
}

Assistant:

int
ndn_sha256_verify(const uint8_t* input_value, uint32_t input_size,
                  const uint8_t* sig_value, uint32_t sig_size)
{
  if (sig_size != NDN_SEC_SHA256_HASH_SIZE)
    return NDN_SEC_WRONG_SIG_SIZE;
  uint8_t input_hash[NDN_SEC_SHA256_HASH_SIZE] = {0};
  ndn_sha256(input_value, input_size, input_hash);
  if (ndn_const_time_memcmp(input_hash, sig_value, sizeof(input_hash)) != 0)
    return NDN_SEC_FAIL_VERIFY_SIG;
  else
    return NDN_SUCCESS;
}